

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

MinVarInfo * __thiscall
adios2::format::BP5Deserializer::MinBlocksInfo
          (BP5Deserializer *this,VariableBase *Var,size_t RelStep,size_t WriterRank,size_t BlockID)

{
  BP5VarRec *pBVar1;
  MinVarInfo *pMVar2;
  reference pvVar3;
  void *pvVar4;
  size_type in_RDX;
  value_type *in_RDI;
  long in_R8;
  char *BlockMaxAddr;
  char *BlockMinAddr;
  MinBlockInfo Blk;
  size_t *Count;
  size_t *Offsets;
  MinMaxStruct *MMs;
  size_t WriterBlockCount;
  MetaArrayRec *writer_meta_base_1;
  size_t Step_1;
  MetaArrayRec *writer_meta_base;
  size_t Step;
  size_t Id;
  size_t StepLoopEnd;
  size_t StepLoopStart;
  size_t AbsStep;
  MinVarInfo *MV;
  BP5VarRec *VarRec;
  void *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  bool bVar5;
  MinVarInfo *this_00;
  int in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *in_stack_ffffffffffffff10;
  size_t *in_stack_ffffffffffffff18;
  int iVar6;
  MinVarInfo *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  MinVarInfo *local_a8;
  long local_98;
  value_type local_80;
  value_type local_70;
  ulong local_60;
  value_type local_58;
  value_type local_50;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  pBVar1 = LookupVarByKey((BP5Deserializer *)
                          CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8);
  pMVar2 = (MinVarInfo *)operator_new(0x38);
  MinVarInfo::MinVarInfo(in_stack_ffffffffffffff20,iVar6,(size_t *)in_stack_ffffffffffffff10);
  this_00 = pMVar2;
  local_a8 = in_stack_ffffffffffffff20;
  local_50 = in_RDX;
  if (((ulong)in_RDI->BufferP & 1) != 0) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&pBVar1->AbsStepFromRel,in_RDX);
    local_50 = *pvVar3;
    local_a8 = in_stack_ffffffffffffff20;
  }
  if (((ulong)in_RDI->BufferP & 0x100) == 0) {
    local_58 = local_50;
    local_60 = local_50 + 1;
  }
  else {
    local_58 = 0;
    local_60 = std::
               vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
               ::size((vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                       *)(in_RDI + 3));
  }
  pMVar2->Step = in_RDX;
  pMVar2->Dims = (int)pBVar1->DimCount;
  pMVar2->Shape = (size_t *)0x0;
  bVar5 = false;
  if (1 < pMVar2->Dims) {
    bVar5 = ((byte)in_RDI->BlockID & 1) != (*(byte *)((long)&in_RDI->BlockID + 1) & 1);
  }
  pMVar2->IsReverseDims = bVar5;
  pMVar2->WasLocalValue = pBVar1->OrigShapeID == LocalValue;
  for (local_70 = local_58; local_70 < local_60; local_70 = local_70 + 1) {
    pvVar4 = GetMetadataBase((BP5Deserializer *)in_stack_ffffffffffffff38,
                             (BP5VarRec *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                             (size_t)local_a8);
    if ((pvVar4 != (void *)0x0) && (pMVar2->Shape == (size_t *)0x0)) {
      pMVar2->Shape = *(size_t **)((long)pvVar4 + 0x18);
    }
  }
  std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::reserve
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
            );
  for (local_80 = local_58; local_80 < local_60; local_80 = local_80 + 1) {
    pvVar4 = GetMetadataBase((BP5Deserializer *)in_stack_ffffffffffffff38,
                             (BP5VarRec *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                             (size_t)local_a8);
    if (pvVar4 != (void *)0x0) {
      local_98 = 0;
      if (pBVar1->MinMaxOffset != 0xffffffffffffffff) {
        local_98 = *(long *)((long)pvVar4 + pBVar1->MinMaxOffset);
      }
      local_a8 = (MinVarInfo *)0x0;
      if (*(long *)((long)pvVar4 + 0x20) != 0) {
        local_a8 = (MinVarInfo *)(*(long *)((long)pvVar4 + 0x20) + in_R8 * pMVar2->Dims * 8);
      }
      MinBlockInfo::MinBlockInfo((MinBlockInfo *)&stack0xffffffffffffff08);
      MinMaxStruct::Init((MinMaxStruct *)&stack0xffffffffffffff28,pBVar1->Type);
      if (local_98 != 0) {
        iVar6 = pBVar1->ElementSize;
        ApplyElementMinMax((MinMaxStruct *)&stack0xffffffffffffff28,pBVar1->Type,
                           (void *)(local_98 + in_R8 * 2 * (long)pBVar1->ElementSize));
        ApplyElementMinMax((MinMaxStruct *)&stack0xffffffffffffff28,pBVar1->Type,
                           (void *)(local_98 + (in_R8 * 2 + 1) * (long)iVar6));
      }
      std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::push_back
                ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)this_00,
                 in_RDI);
    }
  }
  return pMVar2;
}

Assistant:

MinVarInfo *BP5Deserializer::MinBlocksInfo(const VariableBase &Var, size_t RelStep,
                                           size_t WriterRank, size_t BlockID)
{
    // this is only called for global and local arrays, so limited
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);

    MinVarInfo *MV = new MinVarInfo((int)VarRec->DimCount, VarRec->GlobalDims);

    size_t AbsStep = RelStep;
    size_t StepLoopStart, StepLoopEnd;

    if (m_RandomAccessMode)
    {
        AbsStep = VarRec->AbsStepFromRel[RelStep];
    }
    if (m_FlattenSteps)
    {
        StepLoopStart = 0;
        StepLoopEnd = m_ControlArray.size();
    }
    else
    {
        StepLoopStart = AbsStep;
        StepLoopEnd = AbsStep + 1;
    }
    size_t Id = 0;
    MV->Step = RelStep;
    MV->Dims = (int)VarRec->DimCount;
    MV->Shape = NULL;
    MV->IsReverseDims = ((MV->Dims > 1) && (m_WriterIsRowMajor != m_ReaderIsRowMajor));

    MV->WasLocalValue = (VarRec->OrigShapeID == ShapeID::LocalValue);
    if ((VarRec->OrigShapeID == ShapeID::LocalValue) ||
        (VarRec->OrigShapeID == ShapeID::GlobalValue))
    {
        // Throw
    }
    for (size_t Step = StepLoopStart; Step < StepLoopEnd; Step++)
    {
        MetaArrayRec *writer_meta_base = (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);
        if (writer_meta_base)
        {
            if (MV->Shape == NULL)
            {
                MV->Shape = writer_meta_base->Shape;
            }
            Id += 1; // one block
        }
    }
    MV->BlocksInfo.reserve(Id);

    Id = BlockID;
    for (size_t Step = StepLoopStart; Step < StepLoopEnd; Step++)
    {
        MetaArrayRec *writer_meta_base = (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);

        if (!writer_meta_base)
            continue;
        size_t WriterBlockCount = MV->Dims ? writer_meta_base->DBCount / MV->Dims : 1;
        if (BlockID >= WriterBlockCount)
        {
            // throw
        }
        MinMaxStruct *MMs = NULL;
        if (VarRec->MinMaxOffset != SIZE_MAX)
        {
            MMs = *(MinMaxStruct **)(((char *)writer_meta_base) + VarRec->MinMaxOffset);
        }
        size_t *Offsets = NULL;
        size_t *Count = NULL;
        if (writer_meta_base->Offsets)
            Offsets = writer_meta_base->Offsets + (BlockID * MV->Dims);
        if (writer_meta_base->Count)
            Count = writer_meta_base->Count + (BlockID * MV->Dims);
        MinBlockInfo Blk;
        Blk.WriterID = (int)WriterRank;
        Blk.BlockID = Id;
        Blk.Start = Offsets;
        Blk.Count = Count;
        Blk.MinMax.Init(VarRec->Type);
        if (MMs)
        {
            char *BlockMinAddr = (((char *)MMs) + 2 * BlockID * VarRec->ElementSize);
            char *BlockMaxAddr = (((char *)MMs) + (2 * BlockID + 1) * VarRec->ElementSize);
            ApplyElementMinMax(Blk.MinMax, VarRec->Type, (void *)BlockMinAddr);
            ApplyElementMinMax(Blk.MinMax, VarRec->Type, (void *)BlockMaxAddr);
        }
        // Blk.BufferP
        MV->BlocksInfo.push_back(Blk);
    }
    return MV;
}